

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SrcListAssignCursors(Parse *pParse,SrcList *pList)

{
  int iVar1;
  SrcItem *local_28;
  SrcItem *pItem;
  int i;
  SrcList *pList_local;
  Parse *pParse_local;
  
  if (pList != (SrcList *)0x0) {
    local_28 = pList->a;
    for (pItem._4_4_ = 0; pItem._4_4_ < pList->nSrc; pItem._4_4_ = pItem._4_4_ + 1) {
      if (local_28->iCursor < 0) {
        iVar1 = pParse->nTab;
        pParse->nTab = iVar1 + 1;
        local_28->iCursor = iVar1;
        if (local_28->pSelect != (Select *)0x0) {
          sqlite3SrcListAssignCursors(pParse,local_28->pSelect->pSrc);
        }
      }
      local_28 = local_28 + 1;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListAssignCursors(Parse *pParse, SrcList *pList){
  int i;
  SrcItem *pItem;
  assert( pList || pParse->db->mallocFailed );
  if( ALWAYS(pList) ){
    for(i=0, pItem=pList->a; i<pList->nSrc; i++, pItem++){
      if( pItem->iCursor>=0 ) continue;
      pItem->iCursor = pParse->nTab++;
      if( pItem->pSelect ){
        sqlite3SrcListAssignCursors(pParse, pItem->pSelect->pSrc);
      }
    }
  }
}